

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Section::Section(Section *this,SectionInfo *info)

{
  pointer pcVar1;
  int iVar2;
  IResultCapture *pIVar3;
  timeval t;
  timeval local_40;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Section_00149c80;
  (this->m_info).name._M_dataplus._M_p = (pointer)&(this->m_info).name.field_2;
  pcVar1 = (info->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_info,pcVar1,pcVar1 + (info->name)._M_string_length);
  (this->m_info).description._M_dataplus._M_p = (pointer)&(this->m_info).description.field_2;
  pcVar1 = (info->description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_info).description,pcVar1,
             pcVar1 + (info->description)._M_string_length);
  (this->m_info).lineInfo.file._M_dataplus._M_p = (pointer)&(this->m_info).lineInfo.file.field_2;
  pcVar1 = (info->lineInfo).file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_info).lineInfo,pcVar1,
             pcVar1 + (info->lineInfo).file._M_string_length);
  (this->m_info).lineInfo.line = (info->lineInfo).line;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_assertions).passed = 0;
  (this->m_assertions).failed = 0;
  (this->m_assertions).failedButOk = 0;
  pIVar3 = getResultCapture();
  iVar2 = (*pIVar3->_vptr_IResultCapture[3])(pIVar3,&this->m_info,&this->m_assertions);
  this->m_sectionIncluded = SUB41(iVar2,0);
  (this->m_timer).m_ticks = 0;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  (this->m_timer).m_ticks = local_40.tv_sec * 1000000 + local_40.tv_usec;
  return;
}

Assistant:

Section::Section( SectionInfo const& info )
    :   m_info( info ),
        m_sectionIncluded( getResultCapture().sectionStarted( m_info, m_assertions ) )
    {
        m_timer.start();
    }